

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

void __thiscall xmrig::Client::reconnect(Client *this)

{
  ulong uVar1;
  long lVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  mapped_type *ppCVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  mapped_type pCVar7;
  iterator __position;
  IClientListener *pIVar8;
  bool bVar9;
  ulong local_18;
  
  pIVar8 = (this->super_BaseClient).m_listener;
  if (pIVar8 != (IClientListener *)0x0) {
    this->m_keepAlive = 0;
    if ((this->super_BaseClient).m_failures == -1) {
      UNRECOVERED_JUMPTABLE = pIVar8->_vptr_IClientListener[2];
      lVar2 = 0xffffffff;
    }
    else {
      if ((this->super_BaseClient).m_state != ReconnectingState) {
        lVar2 = std::chrono::_V2::steady_clock::now();
        this->m_expire = lVar2 / 1000000 + (this->super_BaseClient).m_retryPause;
        (this->super_BaseClient).m_state = ReconnectingState;
      }
      pIVar8 = (this->super_BaseClient).m_listener;
      lVar2 = (this->super_BaseClient).m_failures + 1;
      (this->super_BaseClient).m_failures = lVar2;
      UNRECOVERED_JUMPTABLE = pIVar8->_vptr_IClientListener[2];
    }
    (*UNRECOVERED_JUMPTABLE)(pIVar8,this,lVar2);
    return;
  }
  uVar1 = this->m_key;
  lVar2 = 0x1b18e0;
  if (m_storage._16_8_ != 0) {
    lVar2 = 0x1b18e0;
    lVar5 = m_storage._16_8_;
    do {
      bVar9 = *(ulong *)(lVar5 + 0x20) < uVar1;
      if (!bVar9) {
        lVar2 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)bVar9 * 8);
    } while (lVar5 != 0);
  }
  local_18 = uVar1;
  if ((lVar2 == 0x1b18e0) || (uVar1 < *(ulong *)(lVar2 + 0x20))) {
    pCVar7 = (mapped_type)0x0;
  }
  else {
    ppCVar3 = std::
              map<unsigned_long,_xmrig::Client_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::Client_*>_>_>
              ::at((map<unsigned_long,_xmrig::Client_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::Client_*>_>_>
                    *)m_storage,&local_18);
    pCVar7 = *ppCVar3;
  }
  if (pCVar7 != (mapped_type)0x0) {
    p_Var4 = (_Base_ptr)(m_storage + 8);
    if (m_storage._16_8_ != 0) {
      p_Var4 = (_Base_ptr)(m_storage + 8);
      p_Var6 = (_Base_ptr)m_storage._16_8_;
      do {
        if (*(ulong *)(p_Var6 + 1) >= uVar1) {
          p_Var4 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar1];
      } while (p_Var6 != (_Base_ptr)0x0);
    }
    __position._M_node = (_Base_ptr)(m_storage + 8);
    if ((p_Var4 != (_Base_ptr)(m_storage + 8)) &&
       (__position._M_node = (_Base_ptr)(m_storage + 8), *(ulong *)(p_Var4 + 1) <= uVar1)) {
      __position._M_node = p_Var4;
    }
    if (__position._M_node != (_Base_ptr)(m_storage + 8)) {
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::Client*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::Client*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::Client*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::Client*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::Client*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::Client*>>>
                          *)m_storage,__position);
    }
    (*(pCVar7->super_BaseClient).super_IClient._vptr_IClient[1])(pCVar7);
  }
  return;
}

Assistant:

void xmrig::Client::reconnect()
{
    if (!m_listener) {
        m_storage.remove(m_key);

        return;
    }

    m_keepAlive = 0;

    if (m_failures == -1) {
        return m_listener->onClose(this, -1);
    }

    setState(ReconnectingState);

    m_failures++;
    m_listener->onClose(this, static_cast<int>(m_failures));
}